

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

Iterator *
leveldb::NewDBIterator
          (DBImpl *db,Comparator *user_key_comparator,Iterator *internal_iter,
          SequenceNumber sequence,uint32_t seed)

{
  Iterator *pIVar1;
  undefined8 in_RDI;
  uint32_t seed_00;
  long in_FS_OFFSET;
  Iterator *unaff_retaddr;
  Comparator *in_stack_00000008;
  DBImpl *in_stack_00000010;
  DBIter *in_stack_00000018;
  SequenceNumber s;
  
  seed_00 = (uint32_t)((ulong)in_RDI >> 0x20);
  s = *(SequenceNumber *)(in_FS_OFFSET + 0x28);
  pIVar1 = (Iterator *)operator_new(0xa8);
  anon_unknown_3::DBIter::DBIter
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,s,seed_00);
  if (*(SequenceNumber *)(in_FS_OFFSET + 0x28) == s) {
    return pIVar1;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* NewDBIterator(DBImpl* db, const Comparator* user_key_comparator,
                        Iterator* internal_iter, SequenceNumber sequence,
                        uint32_t seed) {
  return new DBIter(db, user_key_comparator, internal_iter, sequence, seed);
}